

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int wb_write_out(archive_write *a)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  ulong __n;
  int local_2c;
  int r;
  size_t nw;
  size_t wsize;
  iso9660_conflict *iso9660;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  lVar2 = *(long *)((long)pvVar1 + 0x102e0);
  uVar3 = -lVar2 + 0x10000;
  __n = uVar3 & 0x7ff;
  if (*(int *)((long)pvVar1 + 0x102e8) == 0) {
    local_2c = __archive_write_output(a,(void *)((long)pvVar1 + 0x2dc),uVar3 - __n);
  }
  else {
    local_2c = write_to_temp(a,(void *)((long)pvVar1 + 0x2dc),uVar3 - __n);
  }
  *(ulong *)((long)pvVar1 + 0x102f0) = (uVar3 - __n) + *(long *)((long)pvVar1 + 0x102f0);
  if (*(long *)((long)pvVar1 + 0x102f8) < *(long *)((long)pvVar1 + 0x102f0)) {
    *(undefined8 *)((long)pvVar1 + 0x102f8) = *(undefined8 *)((long)pvVar1 + 0x102f0);
  }
  *(undefined8 *)((long)pvVar1 + 0x102e0) = 0x10000;
  if (__n != 0) {
    *(ulong *)((long)pvVar1 + 0x102e0) = *(long *)((long)pvVar1 + 0x102e0) - __n;
    memmove((void *)((long)pvVar1 + 0x2dc),(void *)((long)pvVar1 + ((-lVar2 + 0x102dc) - __n)),__n);
  }
  return local_2c;
}

Assistant:

static int
wb_write_out(struct archive_write *a)
{
	struct iso9660 *iso9660 = (struct iso9660 *)a->format_data;
	size_t wsize, nw;
	int r;

	wsize = sizeof(iso9660->wbuff) - iso9660->wbuff_remaining;
	nw = wsize % LOGICAL_BLOCK_SIZE;
	if (iso9660->wbuff_type == WB_TO_STREAM)
		r = __archive_write_output(a, iso9660->wbuff, wsize - nw);
	else
		r = write_to_temp(a, iso9660->wbuff, wsize - nw);
	/* Increase the offset. */
	iso9660->wbuff_offset += wsize - nw;
	if (iso9660->wbuff_offset > iso9660->wbuff_written)
		iso9660->wbuff_written = iso9660->wbuff_offset;
	iso9660->wbuff_remaining = sizeof(iso9660->wbuff);
	if (nw) {
		iso9660->wbuff_remaining -= nw;
		memmove(iso9660->wbuff, iso9660->wbuff + wsize - nw, nw);
	}
	return (r);
}